

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

int ebur128_loudness_momentary(ebur128_state *st,double *out)

{
  double dVar1;
  double dStack_28;
  int error;
  double energy;
  double *out_local;
  ebur128_state *st_local;
  
  energy = (double)out;
  out_local = (double *)st;
  st_local._4_4_ =
       ebur128_energy_in_interval(st,st->d->samples_in_100ms << 2,&stack0xffffffffffffffd8);
  if (st_local._4_4_ == 0) {
    if (0.0 < dStack_28) {
      dVar1 = ebur128_energy_to_loudness(dStack_28);
      *(double *)energy = dVar1;
      st_local._4_4_ = 0;
    }
    else {
      *(undefined8 *)energy = 0xfff0000000000000;
      st_local._4_4_ = 0;
    }
  }
  return st_local._4_4_;
}

Assistant:

int ebur128_loudness_momentary(ebur128_state* st, double* out) {
  double energy;
  int error;

  error = ebur128_energy_in_interval(st, st->d->samples_in_100ms * 4, &energy);
  if (error) {
    return error;
  }

  if (energy <= 0.0) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }

  *out = ebur128_energy_to_loudness(energy);
  return EBUR128_SUCCESS;
}